

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpResize_Lagrange
              (ARKodeMem_conflict ark_mem,ARKInterp I,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  
  iVar1 = 0;
  if (I != (ARKInterp)0x0) {
    pvVar3 = I->content;
    if (*(long *)((long)pvVar3 + 8) == 0) {
LAB_001316bb:
      iVar1 = 0;
      *(undefined4 *)((long)pvVar3 + 0x18) = 0;
    }
    else {
      lVar4 = -1;
      lVar2 = 0;
      do {
        pvVar3 = I->content;
        lVar4 = lVar4 + 1;
        if (*(int *)((long)pvVar3 + 4) <= lVar4) goto LAB_001316bb;
        iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)(lVar2 + *(long *)((long)pvVar3 + 8)));
        lVar2 = lVar2 + 8;
      } while (iVar1 != 0);
      iVar1 = -0x14;
    }
  }
  return iVar1;
}

Assistant:

int arkInterpResize_Lagrange(ARKodeMem ark_mem, ARKInterp I,
                             ARKVecResizeFn resize, void* resize_data,
                             sunindextype lrw_diff, sunindextype liw_diff,
                             N_Vector y0)
{
  int i;

  /* resize vectors */
  if (I == NULL) { return (ARK_SUCCESS); }
  if (LINT_YHIST(I) != NULL)
  {
    for (i = 0; i < LINT_NMAXALLOC(I); i++)
    {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                        &(LINT_YJ(I, i))))
      {
        return (ARK_MEM_FAIL);
      }
    }
  }

  /* reset active history length */
  LINT_NHIST(I) = 0;

  return (ARK_SUCCESS);
}